

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O2

Relations dg::vr::Relations::conflicting(Type type)

{
  Relations *pRVar1;
  _Base_bitset<1UL> *this;
  _Base_bitset<1UL> local_8;
  
  this = &local_8;
  switch(type) {
  case EQ:
    local_8._M_w = 0;
    pRVar1 = ne((Relations *)&local_8);
    pRVar1 = slt(pRVar1);
    pRVar1 = ult(pRVar1);
    this = (_Base_bitset<1UL> *)sgt(pRVar1);
    goto LAB_00101333;
  case NE:
    local_8._M_w = 0;
    pRVar1 = eq((Relations *)&local_8);
    break;
  case SLE:
    local_8._M_w = 0;
    pRVar1 = sgt((Relations *)&local_8);
    break;
  case SLT:
    local_8._M_w = 0;
    pRVar1 = eq((Relations *)&local_8);
    pRVar1 = sgt(pRVar1);
    pRVar1 = sge(pRVar1);
    break;
  case ULE:
    local_8._M_w = 0;
LAB_00101333:
    pRVar1 = ugt((Relations *)this);
    break;
  case ULT:
    local_8._M_w = 0;
    pRVar1 = eq((Relations *)&local_8);
    pRVar1 = ugt(pRVar1);
    pRVar1 = uge(pRVar1);
    break;
  case SGE:
    local_8._M_w = 0;
    pRVar1 = slt((Relations *)&local_8);
    break;
  case SGT:
    local_8._M_w = 0;
    pRVar1 = eq((Relations *)&local_8);
    pRVar1 = slt(pRVar1);
    pRVar1 = sle(pRVar1);
    break;
  case UGE:
    local_8._M_w = 0;
    pRVar1 = ult((Relations *)&local_8);
    break;
  case UGT:
    local_8._M_w = 0;
    pRVar1 = eq((Relations *)&local_8);
    pRVar1 = ult(pRVar1);
    pRVar1 = ule(pRVar1);
    break;
  case PT:
  case PF:
    return (Relations)0;
  default:
    abort();
  }
  return (Relations)(pRVar1->bits).super__Base_bitset<1UL>._M_w;
}

Assistant:

Relations Relations::conflicting(Relations::Type type) {
    switch (type) {
    case EQ:
        return Relations().ne().slt().ult().sgt().ugt();
    case NE:
        return Relations().eq();
    case SLT:
        return Relations().eq().sgt().sge();
    case ULT:
        return Relations().eq().ugt().uge();
    case SGT:
        return Relations().eq().slt().sle();
    case UGT:
        return Relations().eq().ult().ule();
    case SLE:
        return Relations().sgt();
    case ULE:
        return Relations().ugt();
    case SGE:
        return Relations().slt();
    case UGE:
        return Relations().ult();
    case PT:
    case PF:
        return {};
    }
    assert(0 && "unreachable");
    abort();
}